

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

uint __thiscall crnlib::symbol_codec::get_bits(symbol_codec *this,uint num_bits)

{
  int iVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  bit_buf_t bVar6;
  
  if (num_bits == 0) {
    return 0;
  }
  iVar3 = this->m_bit_count;
  if (iVar3 < (int)num_bits) {
    pbVar2 = this->m_pDecode_buf_next;
    pbVar4 = this->m_pDecode_buf_end;
    do {
      if (pbVar2 == pbVar4) {
        uVar5 = 0;
        if (this->m_decode_buf_eof == false) {
          (*this->m_pDecode_need_bytes_func)
                    ((long)pbVar4 - (long)this->m_pDecode_buf,this->m_pDecode_private_data,
                     &this->m_pDecode_buf,&this->m_decode_buf_size,&this->m_decode_buf_eof);
          pbVar2 = this->m_pDecode_buf;
          pbVar4 = pbVar2 + this->m_decode_buf_size;
          this->m_pDecode_buf_end = pbVar4;
          this->m_pDecode_buf_next = pbVar2;
          if (0 < (long)this->m_decode_buf_size) goto LAB_0019b925;
        }
      }
      else {
LAB_0019b925:
        this->m_pDecode_buf_next = pbVar2 + 1;
        uVar5 = (uint)*pbVar2;
        pbVar2 = pbVar2 + 1;
      }
      iVar1 = this->m_bit_count;
      iVar3 = iVar1 + 8;
      this->m_bit_count = iVar3;
      bVar6 = uVar5 << (0x18U - (char)iVar1 & 0x1f) | this->m_bit_buf;
      this->m_bit_buf = bVar6;
    } while (iVar3 < (int)num_bits);
  }
  else {
    bVar6 = this->m_bit_buf;
  }
  this->m_bit_buf = bVar6 << ((byte)num_bits & 0x1f);
  this->m_bit_count = iVar3 - num_bits;
  return bVar6 >> (-(byte)num_bits & 0x1f);
}

Assistant:

uint symbol_codec::get_bits(uint num_bits)
    {
        CRNLIB_ASSERT(num_bits <= 25);

        if (!num_bits)
        {
            return 0;
        }

        while (m_bit_count < (int)num_bits)
        {
            uint c = 0;
            if (m_pDecode_buf_next == m_pDecode_buf_end)
            {
                if (!m_decode_buf_eof)
                {
                    m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
                    m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
                    m_pDecode_buf_next = m_pDecode_buf;
                    if (m_pDecode_buf_next < m_pDecode_buf_end)
                    {
                        c = *m_pDecode_buf_next++;
                    }
                }
            }
            else
            {
                c = *m_pDecode_buf_next++;
            }

            m_bit_count += 8;
            CRNLIB_ASSERT(m_bit_count <= cBitBufSize);

            m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
        }

        uint result = static_cast<uint>(m_bit_buf >> (cBitBufSize - num_bits));

        m_bit_buf <<= num_bits;
        m_bit_count -= num_bits;

        return result;
    }